

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  pointer pcVar1;
  cmCTest *this_00;
  ostream *poVar2;
  string srcdir;
  string fname;
  cmGeneratedFileStream fout;
  string local_2c0;
  string local_2a0;
  long *local_280 [2];
  long local_270 [2];
  cmGeneratedFileStream local_260;
  
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  pcVar1 = (this->Handler->CTestLaunchDir)._M_dataplus._M_p;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,pcVar1,pcVar1 + (this->Handler->CTestLaunchDir)._M_string_length);
  std::__cxx11::string::append((char *)local_280);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_260,(char *)local_280[0],false);
  this_00 = this->CTest;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_2a0,this_00,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_260,"set(CTEST_SOURCE_DIRECTORY \"",0x1c);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_260,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\")\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_260);
  if (local_280[0] != local_270) {
    operator_delete(local_280[0],local_270[0] + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname = this->Handler->CTestLaunchDir;
  fname += "/CTestLaunchConfig.cmake";
  cmGeneratedFileStream fout(fname.c_str());
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}